

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O3

void __thiscall
icu_63::UnescapeTransliterator::handleTransliterate
          (UnescapeTransliterator *this,Replaceable *text,UTransPosition *pos,UBool isIncremental)

{
  UChar UVar1;
  UChar UVar2;
  UChar UVar3;
  ulong uVar4;
  int iVar5;
  uint ch;
  int32_t iVar6;
  int iVar7;
  undefined4 uVar8;
  uint uVar9;
  UChar *pUVar10;
  ulong uVar11;
  UChar UVar12;
  int iVar13;
  UChar32 ch_00;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  UnicodeString str;
  int local_c8;
  uint local_98;
  UnicodeString local_70;
  
  uVar14 = pos->start;
  local_c8 = pos->limit;
  if ((int)uVar14 < local_c8) {
    do {
      pUVar10 = this->spec;
      UVar12 = *pUVar10;
      if (UVar12 != L'\xffff') {
        iVar13 = 0;
LAB_002880a4:
        uVar9 = (uint)(ushort)pUVar10[1];
        UVar3 = pUVar10[2];
        UVar1 = pUVar10[3];
        iVar13 = iVar13 + 5;
        UVar2 = pUVar10[4];
        uVar18 = (ulong)uVar14;
        if (UVar12 == L'\0') {
LAB_00288166:
          ch_00 = 0;
          uVar15 = 0;
          do {
            uVar16 = uVar15;
            if (local_c8 <= (int)uVar18) {
              if (isIncremental != '\0') goto LAB_00288333;
              break;
            }
            ch = (*(text->super_UObject)._vptr_UObject[10])(text,uVar18 & 0xffffffff);
            iVar6 = u_digit_63(ch,(char)UVar3);
            if (iVar6 < 0) break;
            uVar18 = (ulong)(((int)uVar18 - (uint)(ch < 0x10000)) + 2);
            ch_00 = ch_00 * (char)UVar3 + iVar6;
            uVar15 = uVar15 + 1;
            uVar16 = (uint)(ushort)UVar2;
          } while ((ushort)UVar2 != uVar15);
          if (uVar16 < (ushort)UVar1) goto LAB_00288288;
          if (uVar9 != 0) {
            iVar17 = (int)uVar18;
            iVar5 = local_c8;
            if (local_c8 < iVar17) {
              iVar5 = iVar17;
            }
            bVar19 = true;
            uVar4 = 1;
            do {
              uVar11 = uVar4;
              if (uVar11 - (uint)(iVar5 - iVar17) == 1) goto LAB_0028827d;
              iVar7 = (*(text->super_UObject)._vptr_UObject[9])
                                (text,(uVar18 & 0xffffffff) + uVar11 + -1);
              if ((UChar)iVar7 !=
                  this->spec[(long)(int)(iVar13 + (uint)(ushort)UVar12) + (uVar11 - 1)]) break;
              bVar19 = uVar11 < uVar9;
              uVar4 = uVar11 + 1;
            } while (uVar11 != uVar9);
            if (bVar19) goto LAB_00288288;
            uVar18 = (ulong)(uint)(iVar17 + (int)uVar11);
          }
          icu_63::UnicodeString::UnicodeString(&local_70,ch_00);
          (*(text->super_UObject)._vptr_UObject[4])
                    (text,(ulong)uVar14,uVar18 & 0xffffffff,&local_70);
          uVar8 = local_70.fUnion.fFields.fLength;
          if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
            uVar8 = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
          }
          local_c8 = ((local_c8 + uVar14) - (int)uVar18) + uVar8;
          icu_63::UnicodeString::~UnicodeString(&local_70);
          goto LAB_00288309;
        }
        bVar19 = true;
        uVar4 = 1;
        do {
          uVar18 = uVar4;
          if (uVar18 != 1 && local_c8 <= (int)(uVar14 + (int)uVar18 + -1)) goto LAB_0028827d;
          iVar5 = (*(text->super_UObject)._vptr_UObject[9])(text);
          if ((UChar)iVar5 != this->spec[(long)iVar13 + (uVar18 - 1)]) break;
          bVar19 = uVar18 < (ushort)UVar12;
          uVar4 = uVar18 + 1;
        } while ((uVar18 + 1) - (ulong)(ushort)UVar12 != 1);
        if (!bVar19) {
          uVar18 = uVar18 + uVar14;
          goto LAB_00288166;
        }
        goto LAB_00288288;
      }
LAB_00288309:
      if ((int)uVar14 < local_c8) {
        uVar9 = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)uVar14);
        uVar14 = (uVar14 - (uVar9 < 0x10000)) + 2;
      }
    } while ((int)uVar14 < local_c8);
  }
LAB_00288333:
  pos->contextLimit = pos->contextLimit + (local_c8 - pos->limit);
  pos->limit = local_c8;
  pos->start = uVar14;
  return;
LAB_0028827d:
  if (isIncremental != '\0') goto LAB_00288333;
LAB_00288288:
  local_98 = (uint)(ushort)UVar12;
  iVar13 = iVar13 + local_98 + uVar9;
  pUVar10 = this->spec + iVar13;
  UVar12 = *pUVar10;
  if (UVar12 == L'\xffff') goto LAB_00288309;
  goto LAB_002880a4;
}

Assistant:

void UnescapeTransliterator::handleTransliterate(Replaceable& text, UTransPosition& pos,
                                                 UBool isIncremental) const {
    int32_t start = pos.start;
    int32_t limit = pos.limit;
    int32_t i, j, ipat;

    while (start < limit) {
        // Loop over the forms in spec[].  Exit this loop when we
        // match one of the specs.  Exit the outer loop if a
        // partial match is detected and isIncremental is true.
        for (j=0, ipat=0; spec[ipat] != END; ++j) {

            // Read the header
            int32_t prefixLen = spec[ipat++];
            int32_t suffixLen = spec[ipat++];
            int8_t  radix     = (int8_t) spec[ipat++];
            int32_t minDigits = spec[ipat++];
            int32_t maxDigits = spec[ipat++];

            // s is a copy of start that is advanced over the
            // characters as we parse them.
            int32_t s = start;
            UBool match = TRUE;

            for (i=0; i<prefixLen; ++i) {
                if (s >= limit) {
                    if (i > 0) {
                        // We've already matched a character.  This is
                        // a partial match, so we return if in
                        // incremental mode.  In non-incremental mode,
                        // go to the next spec.
                        if (isIncremental) {
                            goto exit;
                        }
                        match = FALSE;
                        break;
                    }
                }
                UChar c = text.charAt(s++);
                if (c != spec[ipat + i]) {
                    match = FALSE;
                    break;
                }
            }

            if (match) {
                UChar32 u = 0;
                int32_t digitCount = 0;
                for (;;) {
                    if (s >= limit) {
                        // Check for partial match in incremental mode.
                        if (s > start && isIncremental) {
                            goto exit;
                        }
                        break;
                    }
                    UChar32 ch = text.char32At(s);
                    int32_t digit = u_digit(ch, radix);
                    if (digit < 0) {
                        break;
                    }
                    s += U16_LENGTH(ch);
                    u = (u * radix) + digit;
                    if (++digitCount == maxDigits) {
                        break;
                    }
                }

                match = (digitCount >= minDigits);

                if (match) {
                    for (i=0; i<suffixLen; ++i) {
                        if (s >= limit) {
                            // Check for partial match in incremental mode.
                            if (s > start && isIncremental) {
                                goto exit;
                            }
                            match = FALSE;
                            break;
                        }
                        UChar c = text.charAt(s++);
                        if (c != spec[ipat + prefixLen + i]) {
                            match = FALSE;
                            break;
                        }
                    }

                    if (match) {
                        // At this point, we have a match
                        UnicodeString str(u);
                        text.handleReplaceBetween(start, s, str);
                        limit -= s - start - str.length();
                        // The following break statement leaves the
                        // loop that is traversing the forms in
                        // spec[].  We then parse the next input
                        // character.
                        break;
                    }
                }
            }

            ipat += prefixLen + suffixLen;
        }

        if (start < limit) {
            start += U16_LENGTH(text.char32At(start));
        }
    }

  exit:
    pos.contextLimit += limit - pos.limit;
    pos.limit = limit;
    pos.start = start;
}